

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O2

Vec_Ptr_t * Nwk_ManRetimeCutBackward(Nwk_Man_t *pMan,int nLatches,int fVerbose)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  void *pvVar5;
  Nwk_Obj_t *pObj;
  Vec_Ptr_t *p;
  long *Entry;
  abctime aVar6;
  int iVar7;
  uint uVar8;
  
  aVar4 = Abc_Clock();
  pMan->nLatches = nLatches;
  uVar1 = *(undefined8 *)(pMan->nObjs + 1);
  pMan->nTruePis = (int)uVar1 - nLatches;
  pMan->nTruePos = (int)((ulong)uVar1 >> 0x20) - nLatches;
  for (iVar7 = 0; iVar7 < pMan->vCis->nSize; iVar7 = iVar7 + 1) {
    pvVar5 = Vec_PtrEntry(pMan->vCis,iVar7);
    *(byte *)((long)pvVar5 + 0x20) = *(byte *)((long)pvVar5 + 0x20) | 0x10;
  }
  for (iVar7 = 0; iVar7 < pMan->nTruePos; iVar7 = iVar7 + 1) {
    pObj = (Nwk_Obj_t *)Vec_PtrEntry(pMan->vCos,iVar7);
    Nwk_ManMarkTfiCone_rec(pObj);
  }
  for (iVar7 = 0; iVar7 < pMan->vObjs->nSize; iVar7 = iVar7 + 1) {
    pvVar5 = Vec_PtrEntry(pMan->vObjs,iVar7);
    if (((pvVar5 != (void *)0x0) && ((*(uint *)((long)pvVar5 + 0x20) & 7) == 3)) &&
       (*(int *)((long)pvVar5 + 0x3c) == 0)) {
      *(uint *)((long)pvVar5 + 0x20) = *(uint *)((long)pvVar5 + 0x20) | 0x10;
    }
  }
  Nwk_ManIncrementTravIdFlow(pMan);
  uVar8 = 0;
  for (iVar7 = 0; iVar7 < pMan->nLatches; iVar7 = iVar7 + 1) {
    pvVar5 = Vec_PtrEntry(pMan->vCos,pMan->nTruePos + iVar7);
    iVar2 = Nwk_ManPushBackwardFast_rec
                      ((Nwk_Obj_t *)**(undefined8 **)((long)pvVar5 + 0x48),(Nwk_Obj_t *)0x0);
    if (iVar2 != 0) {
      Nwk_ManIncrementTravIdFlow(pMan);
      uVar8 = uVar8 + 1;
    }
  }
  if (fVerbose != 0) {
    printf("Backward: Max-flow = %4d -> ",(ulong)uVar8);
  }
  Nwk_ManIncrementTravIdFlow(pMan);
  iVar7 = 0;
  for (iVar2 = 0; iVar2 < pMan->nLatches; iVar2 = iVar2 + 1) {
    pvVar5 = Vec_PtrEntry(pMan->vCos,pMan->nTruePos + iVar2);
    iVar3 = Nwk_ManPushBackwardBot_rec
                      ((Nwk_Obj_t *)**(undefined8 **)((long)pvVar5 + 0x48),(Nwk_Obj_t *)0x0);
    if (iVar3 != 0) {
      Nwk_ManIncrementTravIdFlow(pMan);
      iVar7 = iVar7 + 1;
    }
  }
  if (fVerbose != 0) {
    printf("%4d.  ",(ulong)(iVar7 + uVar8));
  }
  if (0 < iVar7) {
    Nwk_ManIncrementTravIdFlow(pMan);
    iVar2 = 0;
    while (iVar2 < pMan->nLatches) {
      pvVar5 = Vec_PtrEntry(pMan->vCos,pMan->nTruePos + iVar2);
      iVar3 = Nwk_ManPushBackwardBot_rec
                        ((Nwk_Obj_t *)**(undefined8 **)((long)pvVar5 + 0x48),(Nwk_Obj_t *)0x0);
      iVar2 = iVar2 + 1;
      if (iVar3 != 0) {
        __assert_fail("!RetValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFlow.c"
                      ,0x23a,"Vec_Ptr_t *Nwk_ManRetimeCutBackward(Nwk_Man_t *, int, int)");
      }
    }
  }
  p = Vec_PtrAlloc(iVar7 + uVar8);
  iVar7 = 0;
  do {
    if (pMan->vObjs->nSize <= iVar7) {
      uVar8 = 0;
      for (iVar7 = 0; iVar7 < pMan->nLatches; iVar7 = iVar7 + 1) {
        pvVar5 = Vec_PtrEntry(pMan->vCos,pMan->nTruePos + iVar7);
        uVar8 = uVar8 + ((int)((long *)**(long **)((long)pvVar5 + 0x48))[5] ==
                        *(int *)(*(long *)**(long **)((long)pvVar5 + 0x48) + 0x68) + -2);
      }
      Nwk_ManCleanMarks(pMan);
      if (fVerbose != 0) {
        iVar7 = 0x751645;
        printf("Min-cut = %4d.  Unmoved = %4d. ",(ulong)(uint)p->nSize,(ulong)uVar8);
        Abc_Print(iVar7,"%s =","Time");
        aVar6 = Abc_Clock();
        Abc_Print(iVar7,"%9.2f sec\n",(double)(aVar6 - aVar4) / 1000000.0);
      }
      return p;
    }
    Entry = (long *)Vec_PtrEntry(pMan->vObjs,iVar7);
    if ((Entry != (long *)0x0) && ((int)Entry[5] == *(int *)(*Entry + 0x68) + -2)) {
      if ((*(uint *)(Entry + 4) & 0x20) == 0) {
        __assert_fail("Nwk_ObjHasFlow(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFlow.c"
                      ,0x243,"Vec_Ptr_t *Nwk_ManRetimeCutBackward(Nwk_Man_t *, int, int)");
      }
      if ((*(uint *)(Entry + 4) & 7) == 2) {
        __assert_fail("!Nwk_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFlow.c"
                      ,0x244,"Vec_Ptr_t *Nwk_ManRetimeCutBackward(Nwk_Man_t *, int, int)");
      }
      Vec_PtrPush(p,Entry);
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Nwk_ManRetimeCutBackward( Nwk_Man_t * pMan, int nLatches, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Nwk_Obj_t * pObj;
    int i, RetValue, Counter = 0, Counter2 = 0;
    abctime clk = Abc_Clock();
    // set the sequential parameters
    pMan->nLatches = nLatches;
    pMan->nTruePis = Nwk_ManCiNum(pMan) - nLatches;
    pMan->nTruePos = Nwk_ManCoNum(pMan) - nLatches;
    // mark the CIs, the TFI of POs, and the constant nodes
    Nwk_ManForEachCi( pMan, pObj, i )
        pObj->MarkA = 1;
    Nwk_ManForEachPoSeq( pMan, pObj, i )
        Nwk_ManMarkTfiCone_rec( pObj );
    Nwk_ManForEachNode( pMan, pObj, i )
        if ( Nwk_ObjFaninNum(pObj) == 0 )
            pObj->MarkA = 1;
    // start flow computation from each LI driver
    Nwk_ManIncrementTravIdFlow( pMan );
    Nwk_ManForEachLiSeq( pMan, pObj, i )
    {
        if ( !Nwk_ManPushBackwardFast_rec( Nwk_ObjFanin0(pObj), NULL ) )
            continue;
        Nwk_ManIncrementTravIdFlow( pMan );
        Counter++; 
    }
    if ( fVerbose ) 
    printf( "Backward: Max-flow = %4d -> ", Counter );
    // continue flow computation from each LI driver
    Nwk_ManIncrementTravIdFlow( pMan );
    Nwk_ManForEachLiSeq( pMan, pObj, i )
    {
        if ( !Nwk_ManPushBackwardBot_rec( Nwk_ObjFanin0(pObj), NULL ) )
            continue;
        Nwk_ManIncrementTravIdFlow( pMan );
        Counter2++;
    }
    if ( fVerbose )
    printf( "%4d.  ", Counter+Counter2 );
    // repeat flow computation from each LI driver
    if ( Counter2 > 0 )
    {
        Nwk_ManIncrementTravIdFlow( pMan );
        Nwk_ManForEachLiSeq( pMan, pObj, i )
        {
            RetValue = Nwk_ManPushBackwardBot_rec( Nwk_ObjFanin0(pObj), NULL );
            assert( !RetValue );
        }
    }
    // cut is a set of nodes whose bottom is visited but top is not visited
    vNodes = Vec_PtrAlloc( Counter+Counter2 );
    Nwk_ManForEachObj( pMan, pObj, i )
    {
        if ( Nwk_ObjVisitedBotOnly(pObj) )
        {
            assert( Nwk_ObjHasFlow(pObj) );
            assert( !Nwk_ObjIsCo(pObj) );
            Vec_PtrPush( vNodes, pObj );
        }
    }
    // count CO drivers
    Counter = 0;
    Nwk_ManForEachLiSeq( pMan, pObj, i )
        if ( Nwk_ObjVisitedBotOnly( Nwk_ObjFanin0(pObj) ) )
            Counter++;
    Nwk_ManCleanMarks( pMan );
//    assert( Nwk_ManRetimeVerifyCutBackward(pMan, vNodes) );
    if ( fVerbose )
    {
    printf( "Min-cut = %4d.  Unmoved = %4d. ", Vec_PtrSize(vNodes), Counter );
    ABC_PRT( "Time", Abc_Clock() - clk );
    }
    return vNodes;
}